

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O1

int xmllintShellDu(xmllintShellCtxtPtr ctxt,char *arg,xmlNodePtr tree,xmlNodePtr node2)

{
  int in_EAX;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  
  if (arg != (char *)0x0) {
    iVar5 = 0;
    pcVar3 = arg;
    do {
      iVar4 = *(int *)(pcVar3 + 8);
      if ((iVar4 == 0xd) || (iVar4 == 9)) {
        fwrite("/\n",2,1,(FILE *)ctxt->output);
      }
      else if (iVar4 == 1) {
        iVar4 = iVar5;
        if (0 < iVar5) {
          do {
            fwrite("  ",2,1,(FILE *)ctxt->output);
            iVar4 = iVar4 + -1;
          } while (iVar4 != 0);
        }
        if ((*(long *)(pcVar3 + 0x48) != 0) && (*(long *)(*(long *)(pcVar3 + 0x48) + 0x18) != 0)) {
          fprintf((FILE *)ctxt->output,"%s:");
        }
        fprintf((FILE *)ctxt->output,"%s\n",*(undefined8 *)(pcVar3 + 0x10));
      }
      if ((*(uint *)(pcVar3 + 8) | 4) == 0xd) {
        pcVar1 = *(char **)(pcVar3 + 0x18);
      }
      else if (*(uint *)(pcVar3 + 8) == 5 || *(char **)(pcVar3 + 0x18) == (char *)0x0) {
        if (pcVar3 == arg) {
          pcVar1 = (char *)0x0;
        }
        else {
          pcVar1 = *(char **)(pcVar3 + 0x30);
          if (*(char **)(pcVar3 + 0x30) == (char *)0x0) {
            do {
              pcVar2 = pcVar3;
              if (pcVar2 == arg) break;
              pcVar1 = *(char **)(pcVar2 + 0x28);
              pcVar3 = pcVar2;
              if (pcVar1 != (char *)0x0) {
                pcVar3 = pcVar1;
              }
              iVar5 = iVar5 - (uint)(pcVar1 != (char *)0x0);
              if ((pcVar3 != arg) && (pcVar2 = *(char **)(pcVar3 + 0x30), pcVar2 != (char *)0x0))
              break;
              if (pcVar3 == arg) {
                pcVar2 = (char *)0x0;
                break;
              }
              pcVar2 = (char *)0x0;
            } while (*(long *)(pcVar3 + 0x28) != 0);
            pcVar1 = (char *)0x0;
            if (pcVar2 != arg) {
              pcVar1 = pcVar2;
            }
          }
        }
      }
      else {
        iVar5 = iVar5 + 1;
        pcVar1 = *(char **)(pcVar3 + 0x18);
      }
      pcVar3 = pcVar1;
    } while (pcVar1 != (char *)0x0);
    in_EAX = 0;
  }
  return in_EAX;
}

Assistant:

static int
xmllintShellDu(xmllintShellCtxtPtr ctxt,
           char *arg ATTRIBUTE_UNUSED, xmlNodePtr tree,
           xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNodePtr node;
    int indent = 0, i;

    if (!ctxt)
	return (-1);

    if (tree == NULL)
        return (-1);
    node = tree;
    while (node != NULL) {
        if ((node->type == XML_DOCUMENT_NODE) ||
            (node->type == XML_HTML_DOCUMENT_NODE)) {
            fprintf(ctxt->output, "/\n");
        } else if (node->type == XML_ELEMENT_NODE) {
            for (i = 0; i < indent; i++)
                fprintf(ctxt->output, "  ");
            if ((node->ns) && (node->ns->prefix))
                fprintf(ctxt->output, "%s:", node->ns->prefix);
            fprintf(ctxt->output, "%s\n", node->name);
        } else {
        }

        /*
         * Browse the full subtree, deep first
         */

        if ((node->type == XML_DOCUMENT_NODE) ||
            (node->type == XML_HTML_DOCUMENT_NODE)) {
            node = ((xmlDocPtr) node)->children;
        } else if ((node->children != NULL)
                   && (node->type != XML_ENTITY_REF_NODE)) {
            /* deep first */
            node = node->children;
            indent++;
        } else if ((node != tree) && (node->next != NULL)) {
            /* then siblings */
            node = node->next;
        } else if (node != tree) {
            /* go up to parents->next if needed */
            while (node != tree) {
                if (node->parent != NULL) {
                    node = node->parent;
                    indent--;
                }
                if ((node != tree) && (node->next != NULL)) {
                    node = node->next;
                    break;
                }
                if (node->parent == NULL) {
                    node = NULL;
                    break;
                }
                if (node == tree) {
                    node = NULL;
                    break;
                }
            }
            /* exit condition */
            if (node == tree)
                node = NULL;
        } else
            node = NULL;
    }
    return (0);
}